

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O0

void dlib::blas_bindings::
     matrix_assign_blas_helper<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,void>
     ::
     assign<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
               *src,type alpha,bool add_to,bool transpose)

{
  byte in_CL;
  byte in_DL;
  assignable_ptr_matrix<float> *in_RDI;
  float in_XMM0_Da;
  bool in_stack_00000033;
  type in_stack_00000034;
  assignable_ptr_matrix<float> *in_stack_00000038;
  assignable_ptr_matrix<float> *in_stack_00000040;
  matrix_type temp;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> *in_stack_000000e0;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> *in_stack_000000e8;
  assignable_ptr_matrix<float> *in_stack_000000f0;
  matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *in_stack_ffffffffffffff78;
  matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *m;
  assignable_ptr_matrix<float> *in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_ffffffffffffff90;
  matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  local_48 [50];
  byte local_16;
  byte local_15;
  assignable_ptr_matrix<float> *local_8;
  
  local_15 = in_DL & 1;
  local_16 = in_CL & 1;
  if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
    if (local_15 == 0) {
      zero_matrix<dlib::assignable_ptr_matrix<float>>(in_stack_ffffffffffffff80);
      if ((local_16 & 1) == 0) {
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      }
      else {
        trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (in_stack_ffffffffffffff78);
        trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (in_stack_ffffffffffffff78);
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                  (in_stack_000000f0,
                   (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                    *)in_stack_000000e8,
                   (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                    *)in_stack_000000e0);
      }
      matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::assignable_ptr_matrix<float>>
                (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000033);
    }
    else {
      local_8 = in_RDI;
      assignable_ptr_matrix<float>::nr(in_RDI);
      assignable_ptr_matrix<float>::nc(local_8);
      m = local_48;
      matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
      matrix(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(long)in_stack_ffffffffffffff80);
      zero_matrix<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  *)in_stack_ffffffffffffff80);
      if ((local_16 & 1) == 0) {
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    *)in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      }
      else {
        trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>(m);
        trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>(m);
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                  ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    *)in_stack_000000f0,
                   (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                    *)in_stack_000000e8,
                   (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                    *)in_stack_000000e0);
      }
      matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                (in_stack_00000040,
                 (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  *)in_stack_00000038,in_stack_00000034,in_stack_00000033);
      matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
      ~matrix((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)0x28906c);
    }
  }
  else {
    if (local_15 == 0) {
      zero_matrix<dlib::assignable_ptr_matrix<float>>(in_stack_ffffffffffffff80);
    }
    if ((local_16 & 1) == 0) {
      default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    }
    else {
      trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                (in_stack_ffffffffffffff78);
      trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                (in_stack_ffffffffffffff78);
      default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                (in_stack_000000f0,
                 (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                  *)in_stack_000000e8,
                 (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                  *)in_stack_000000e0);
    }
  }
  return;
}

Assistant:

static void assign (
                dest_exp& dest,
                const matrix_multiply_exp<EXP1,EXP2>& src,
                typename src_exp::type alpha,
                bool add_to,
                bool transpose
            )
            {
                // At some point I need to improve the default (i.e. non BLAS) matrix 
                // multiplication algorithm...

                if (alpha == static_cast<typename src_exp::type>(1))
                {
                    if (add_to == false)
                    {
                        zero_matrix(dest);
                    }

                    if (transpose == false)
                        default_matrix_multiply(dest, src.lhs, src.rhs);
                    else
                        default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));
                }
                else
                {
                    if (add_to)
                    {
                        typename dest_exp::matrix_type temp(dest.nr(),dest.nc());
                        zero_matrix(temp);

                        if (transpose == false)
                            default_matrix_multiply(temp, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(temp, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,temp, alpha,true);
                    }
                    else
                    {
                        zero_matrix(dest);
                        
                        if (transpose == false)
                            default_matrix_multiply(dest, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,dest, alpha, false);
                    }
                }
            }